

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteAiger.c
# Opt level: O0

void Io_WriteAigerGz(Abc_Ntk_t *pNtk,char *pFileName,int fWriteSymbols)

{
  FILE *pFile_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  gzFile file;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pObj_00;
  uchar *pBuffer_00;
  ProgressBar *p;
  Abc_Obj_t *pAVar10;
  size_t sVar11;
  char *pcVar12;
  uint local_ac;
  uint Temp;
  uint uLit;
  uint uLit1;
  uint uLit0;
  uchar *pBuffer;
  int fExtended;
  int nBufferSize;
  int Pos;
  int nNodes;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pObj;
  gzFile pFile;
  ProgressBar *pProgress;
  int fWriteSymbols_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                  ,0x1bd,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
  }
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    fprintf(_stdout,"Io_WriteAigerGz(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    iVar1 = Abc_NtkConstrNum(pNtk);
    pAVar9 = Abc_AigConst1(pNtk);
    Io_ObjSetAigerNum(pAVar9,0);
    nBufferSize = 1;
    for (Pos = 0; iVar2 = Abc_NtkCiNum(pNtk), Pos < iVar2; Pos = Pos + 1) {
      pAVar9 = Abc_NtkCi(pNtk,Pos);
      Io_ObjSetAigerNum(pAVar9,nBufferSize);
      nBufferSize = nBufferSize + 1;
    }
    for (Pos = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), Pos < iVar2; Pos = Pos + 1) {
      pAVar9 = Abc_NtkObj(pNtk,Pos);
      if ((pAVar9 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar9), iVar2 != 0)) {
        Io_ObjSetAigerNum(pAVar9,nBufferSize);
        nBufferSize = nBufferSize + 1;
      }
    }
    iVar2 = Abc_NtkPiNum(pNtk);
    iVar3 = Abc_NtkLatchNum(pNtk);
    iVar4 = Abc_NtkNodeNum(pNtk);
    uVar5 = Abc_NtkPiNum(pNtk);
    uVar6 = Abc_NtkLatchNum(pNtk);
    if (iVar1 == 0) {
      local_ac = Abc_NtkPoNum(pNtk);
    }
    else {
      local_ac = 0;
    }
    iVar7 = Abc_NtkNodeNum(pNtk);
    gzprintf(file,"aig %u %u %u %u %u",(ulong)(uint)(iVar2 + iVar3 + iVar4),(ulong)uVar5,
             (ulong)uVar6,(ulong)local_ac,iVar7);
    if (iVar1 != 0) {
      iVar2 = Abc_NtkPoNum(pNtk);
      iVar3 = Abc_NtkConstrNum(pNtk);
      uVar5 = Abc_NtkConstrNum(pNtk);
      gzprintf(file," %u %u",(ulong)(uint)(iVar2 - iVar3),(ulong)uVar5);
    }
    gzprintf(file,"\n");
    Abc_NtkInvertConstraints(pNtk);
    for (Pos = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), Pos < iVar2; Pos = Pos + 1) {
      pAVar9 = Abc_NtkBox(pNtk,Pos);
      iVar2 = Abc_ObjIsLatch(pAVar9);
      if (iVar2 != 0) {
        pAVar10 = Abc_ObjFanin0(pAVar9);
        pObj_00 = Abc_ObjFanin0(pAVar10);
        uVar5 = Io_ObjAigerNum(pObj_00);
        uVar6 = Abc_ObjFaninC0(pAVar10);
        uVar8 = Io_ObjAigerNum(pObj_00);
        uVar5 = Io_ObjMakeLit(uVar5,uVar6 ^ uVar8 == 0);
        iVar2 = Abc_LatchIsInit0(pAVar9);
        if (iVar2 == 0) {
          iVar2 = Abc_LatchIsInit1(pAVar9);
          if (iVar2 == 0) {
            iVar2 = Abc_LatchIsInitNone(pAVar9);
            if ((iVar2 == 0) && (iVar2 = Abc_LatchIsInitDc(pAVar9), iVar2 == 0)) {
              __assert_fail("Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                            ,0x1ee,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
            }
            pAVar9 = Abc_ObjFanout0(pAVar9);
            uVar6 = Io_ObjAigerNum(pAVar9);
            uVar6 = Io_ObjMakeLit(uVar6,0);
            gzprintf(file,"%u %u\n",(ulong)uVar5,(ulong)uVar6);
          }
          else {
            gzprintf(file,"%u 1\n",(ulong)uVar5);
          }
        }
        else {
          gzprintf(file,"%u\n",(ulong)uVar5);
        }
      }
    }
    for (Pos = 0; iVar2 = Abc_NtkPoNum(pNtk), Pos < iVar2; Pos = Pos + 1) {
      pAVar9 = Abc_NtkPo(pNtk,Pos);
      pAVar10 = Abc_ObjFanin0(pAVar9);
      uVar5 = Io_ObjAigerNum(pAVar10);
      uVar6 = Abc_ObjFaninC0(pAVar9);
      uVar8 = Io_ObjAigerNum(pAVar10);
      uVar5 = Io_ObjMakeLit(uVar5,uVar6 ^ uVar8 == 0);
      gzprintf(file,"%u\n",(ulong)uVar5);
    }
    Abc_NtkInvertConstraints(pNtk);
    fExtended = 0;
    iVar2 = Abc_NtkNodeNum(pNtk);
    iVar3 = iVar2 * 6 + 100;
    pBuffer_00 = (uchar *)malloc((long)iVar3);
    pFile_00 = _stdout;
    iVar4 = Abc_NtkObjNumMax(pNtk);
    p = Extra_ProgressBarStart((FILE *)pFile_00,iVar4);
    for (Pos = 0; iVar4 = Vec_PtrSize(pNtk->vObjs), Pos < iVar4; Pos = Pos + 1) {
      pAVar9 = Abc_NtkObj(pNtk,Pos);
      if ((pAVar9 != (Abc_Obj_t *)0x0) && (iVar4 = Abc_AigNodeIsAnd(pAVar9), iVar4 != 0)) {
        Extra_ProgressBarUpdate(p,Pos,(char *)0x0);
        uVar5 = Io_ObjAigerNum(pAVar9);
        uVar5 = Io_ObjMakeLit(uVar5,0);
        pAVar10 = Abc_ObjFanin0(pAVar9);
        uVar6 = Io_ObjAigerNum(pAVar10);
        iVar4 = Abc_ObjFaninC0(pAVar9);
        uLit = Io_ObjMakeLit(uVar6,iVar4);
        pAVar10 = Abc_ObjFanin1(pAVar9);
        uVar6 = Io_ObjAigerNum(pAVar10);
        iVar4 = Abc_ObjFaninC1(pAVar9);
        uVar6 = Io_ObjMakeLit(uVar6,iVar4);
        Temp = uVar6;
        if (uVar6 < uLit) {
          Temp = uLit;
          uLit = uVar6;
        }
        if (uVar5 <= Temp) {
          __assert_fail("uLit1 < uLit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                        ,0x20b,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
        }
        iVar4 = Io_WriteAigerEncode(pBuffer_00,fExtended,uVar5 - Temp);
        fExtended = Io_WriteAigerEncode(pBuffer_00,iVar4,Temp - uLit);
        if (iVar2 * 6 + 0x5a < fExtended) {
          printf(
                "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n"
                );
          gzclose(file);
          return;
        }
      }
    }
    if (iVar3 <= fExtended) {
      __assert_fail("Pos < nBufferSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteAiger.c"
                    ,0x215,"void Io_WriteAigerGz(Abc_Ntk_t *, char *, int)");
    }
    Extra_ProgressBarStop(p);
    gzwrite(file,pBuffer_00,fExtended);
    if (pBuffer_00 != (uchar *)0x0) {
      free(pBuffer_00);
    }
    if (fWriteSymbols != 0) {
      for (Pos = 0; iVar2 = Abc_NtkPiNum(pNtk), Pos < iVar2; Pos = Pos + 1) {
        pAVar9 = Abc_NtkPi(pNtk,Pos);
        pcVar12 = Abc_ObjName(pAVar9);
        gzprintf(file,"i%d %s\n",(ulong)(uint)Pos,pcVar12);
      }
      for (Pos = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), Pos < iVar2; Pos = Pos + 1) {
        pAVar9 = Abc_NtkBox(pNtk,Pos);
        iVar2 = Abc_ObjIsLatch(pAVar9);
        if (iVar2 != 0) {
          pAVar9 = Abc_ObjFanout0(pAVar9);
          pcVar12 = Abc_ObjName(pAVar9);
          gzprintf(file,"l%d %s\n",(ulong)(uint)Pos,pcVar12);
        }
      }
      for (Pos = 0; iVar2 = Abc_NtkPoNum(pNtk), Pos < iVar2; Pos = Pos + 1) {
        pAVar9 = Abc_NtkPo(pNtk,Pos);
        if (iVar1 == 0) {
          pcVar12 = Abc_ObjName(pAVar9);
          gzprintf(file,"o%d %s\n",(ulong)(uint)Pos,pcVar12);
        }
        else {
          iVar2 = Abc_NtkPoNum(pNtk);
          iVar3 = Abc_NtkConstrNum(pNtk);
          if (Pos < iVar2 - iVar3) {
            pcVar12 = Abc_ObjName(pAVar9);
            gzprintf(file,"b%d %s\n",(ulong)(uint)Pos,pcVar12);
          }
          else {
            iVar2 = Abc_NtkPoNum(pNtk);
            iVar3 = Abc_NtkConstrNum(pNtk);
            pcVar12 = Abc_ObjName(pAVar9);
            gzprintf(file,"c%d %s\n",(ulong)(uint)(Pos - (iVar2 - iVar3)),pcVar12);
          }
        }
      }
    }
    gzprintf(file,"c\n");
    if ((pNtk->pName != (char *)0x0) && (sVar11 = strlen(pNtk->pName), sVar11 != 0)) {
      gzprintf(file,".model %s\n",pNtk->pName);
    }
    pcVar12 = Extra_TimeStamp();
    gzprintf(file,"This file was produced by ABC on %s\n",pcVar12);
    gzprintf(file,"For information about AIGER format, refer to %s\n","http://fmv.jku.at/aiger");
    gzclose(file);
  }
  return;
}

Assistant:

void Io_WriteAigerGz( Abc_Ntk_t * pNtk, char * pFileName, int fWriteSymbols )
{
    ProgressBar * pProgress;
    gzFile pFile;
    Abc_Obj_t * pObj, * pDriver, * pLatch;
    int i, nNodes, Pos, nBufferSize, fExtended;
    unsigned char * pBuffer;
    unsigned uLit0, uLit1, uLit;

    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = gzopen( pFileName, "wb" ); // if pFileName doesn't end in ".gz" then this acts as a passthrough to fopen
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteAigerGz(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    fExtended = Abc_NtkConstrNum(pNtk);

    // set the node numbers to be used in the output file
    nNodes = 0;
    Io_ObjSetAigerNum( Abc_AigConst1(pNtk), nNodes++ );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );
    Abc_AigForEachAnd( pNtk, pObj, i )
        Io_ObjSetAigerNum( pObj, nNodes++ );

    // write the header "M I L O A" where M = I + L + A
    gzprintf( pFile, "aig %u %u %u %u %u", 
              Abc_NtkPiNum(pNtk) + Abc_NtkLatchNum(pNtk) + Abc_NtkNodeNum(pNtk), 
              Abc_NtkPiNum(pNtk),
              Abc_NtkLatchNum(pNtk),
              fExtended ? 0 : Abc_NtkPoNum(pNtk),
              Abc_NtkNodeNum(pNtk) );
    // write the extended header "B C J F"
    if ( fExtended )
        gzprintf( pFile, " %u %u", Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk), Abc_NtkConstrNum(pNtk) );
    gzprintf( pFile, "\n" ); 

    // if the driver node is a constant, we need to complement the literal below
    // because, in the AIGER format, literal 0/1 is represented as number 0/1
    // while, in ABC, constant 1 node has number 0 and so literal 0/1 will be 1/0

    // write latch drivers
    Abc_NtkInvertConstraints( pNtk );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        pObj = Abc_ObjFanin0(pLatch);
        pDriver = Abc_ObjFanin0(pObj);
        uLit = Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) );
        if ( Abc_LatchIsInit0(pLatch) )
            gzprintf( pFile, "%u\n", uLit );
        else if ( Abc_LatchIsInit1(pLatch) )
            gzprintf( pFile, "%u 1\n", uLit );
        else
        {
            // Both None and DC are written as 'uninitialized' e.g. a free boolean value
            assert( Abc_LatchIsInitNone(pLatch) || Abc_LatchIsInitDc(pLatch) );
            gzprintf( pFile, "%u %u\n", uLit, Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanout0(pLatch)), 0 ) );
        }
    }
    // write PO drivers
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        gzprintf( pFile, "%u\n", Io_ObjMakeLit( Io_ObjAigerNum(pDriver), Abc_ObjFaninC0(pObj) ^ (Io_ObjAigerNum(pDriver) == 0) ) );
    }
    Abc_NtkInvertConstraints( pNtk );

    // write the nodes into the buffer
    Pos = 0;
    nBufferSize = 6 * Abc_NtkNodeNum(pNtk) + 100; // skeptically assuming 3 chars per one AIG edge
    pBuffer = ABC_ALLOC( unsigned char, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkObjNumMax(pNtk) );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        uLit  = Io_ObjMakeLit( Io_ObjAigerNum(pObj), 0 );
        uLit0 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin0(pObj)), Abc_ObjFaninC0(pObj) );
        uLit1 = Io_ObjMakeLit( Io_ObjAigerNum(Abc_ObjFanin1(pObj)), Abc_ObjFaninC1(pObj) );
        if ( uLit0 > uLit1 )
        {
            unsigned Temp = uLit0;
            uLit0 = uLit1;
            uLit1 = Temp;
        }
        assert( uLit1 < uLit );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit  - uLit1 );
        Pos = Io_WriteAigerEncode( pBuffer, Pos, uLit1 - uLit0 );
        if ( Pos > nBufferSize - 10 )
        {
            printf( "Io_WriteAiger(): AIGER generation has failed because the allocated buffer is too small.\n" );
	        gzclose( pFile );
            return;
        }
    }
    assert( Pos < nBufferSize );
    Extra_ProgressBarStop( pProgress );

    // write the buffer
    gzwrite(pFile, pBuffer, Pos);
    ABC_FREE( pBuffer );

    // write the symbol table
    if ( fWriteSymbols )
    {
        // write PIs
        Abc_NtkForEachPi( pNtk, pObj, i )
            gzprintf( pFile, "i%d %s\n", i, Abc_ObjName(pObj) );
        // write latches
        Abc_NtkForEachLatch( pNtk, pObj, i )
            gzprintf( pFile, "l%d %s\n", i, Abc_ObjName(Abc_ObjFanout0(pObj)) );
        // write POs
        Abc_NtkForEachPo( pNtk, pObj, i )
            if ( !fExtended )
                gzprintf( pFile, "o%d %s\n", i, Abc_ObjName(pObj) );
            else if ( i < Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
                gzprintf( pFile, "b%d %s\n", i, Abc_ObjName(pObj) );
            else
                gzprintf( pFile, "c%d %s\n", i - (Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk)), Abc_ObjName(pObj) );
    }

    // write the comment
    gzprintf( pFile, "c\n" );
    if ( pNtk->pName && strlen(pNtk->pName) > 0 )
        gzprintf( pFile, ".model %s\n", pNtk->pName );
    gzprintf( pFile, "This file was produced by ABC on %s\n", Extra_TimeStamp() );
    gzprintf( pFile, "For information about AIGER format, refer to %s\n", "http://fmv.jku.at/aiger" );
	gzclose( pFile );
}